

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_FeaturesWithoutEditions_Test::
~ParseEditionsTest_FeaturesWithoutEditions_Test
          (ParseEditionsTest_FeaturesWithoutEditions_Test *this)

{
  ParseEditionsTest_FeaturesWithoutEditions_Test *this_local;
  
  ~ParseEditionsTest_FeaturesWithoutEditions_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, FeaturesWithoutEditions) {
  ExpectHasValidationErrors(
      R"schema(
        syntax = "proto3";
        option features.field_presence = IMPLICIT;
        message TestMessage {
          string foo = 1 [
            default = "hello",
            features.field_presence = EXPLICIT
          ];
        })schema",
      "1:8: Features are only valid under editions.\n"
      "4:17: Features are only valid under editions.\n");
}